

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<duckdb::uhugeint_t>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  undefined8 uVar1;
  uhugeint_t constant;
  uhugeint_t min_value;
  FilterPropagateResult FVar2;
  Value *this_00;
  Value *pVVar3;
  undefined7 in_register_00000011;
  uhugeint_t max_value;
  array_ptr_iterator<duckdb::Value> __begin2;
  uint64_t in_stack_ffffffffffffff88;
  Value *pVVar4;
  Value *local_68;
  
  pVVar3 = constants.ptr;
  uVar1 = *(undefined8 *)(this + 0x30);
  min_value = *(uhugeint_t *)(this + 0x38);
  local_68 = (Value *)0x0;
  if (pVVar3 != (Value *)0x0) {
    pVVar4 = (Value *)CONCAT71(in_register_00000011,comparison_type);
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*
                          ((array_ptr_iterator<duckdb::Value> *)&stack0xffffffffffffff90);
      max_value = Value::GetValueUnsafe<duckdb::uhugeint_t>(this_00);
      constant.upper = (uint64_t)pVVar4;
      constant.lower = in_stack_ffffffffffffff88;
      FVar2 = CheckZonemapTemplated<duckdb::uhugeint_t>
                        (this,(BaseStatistics *)((ulong)stats & 0xff),(ExpressionType)uVar1,
                         min_value,max_value,constant);
      if (FVar2 < FILTER_ALWAYS_FALSE) {
        return FVar2;
      }
      local_68 = (Value *)&(local_68->type_).physical_type_;
      if (pVVar3 <= local_68) {
        local_68 = pVVar3;
      }
    } while ((pVVar4 != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
            (local_68 != pVVar3));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

uhugeint_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.uhugeint;
}